

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCompositeDeepScanLine.cpp
# Opt level: O0

size_t __thiscall anon_unknown.dwarf_604d5::data<float>::totalSamples(data<float> *this)

{
  size_type sVar1;
  const_reference this_00;
  long in_RDI;
  size_t i;
  size_t answer;
  undefined8 local_18;
  undefined8 local_10;
  
  local_10 = 0;
  local_18 = 0;
  while( true ) {
    sVar1 = std::
            vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
            ::size((vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                    *)(in_RDI + 0x80));
    if (sVar1 <= local_18) break;
    this_00 = std::
              vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
              ::operator[]((vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                            *)(in_RDI + 0x80),local_18);
    sVar1 = std::
            vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            ::size(this_00);
    local_10 = sVar1 + local_10;
    local_18 = local_18 + 1;
  }
  return local_10;
}

Assistant:

size_t totalSamples () const
    {
        size_t answer = 0;
        for (size_t i = 0; i < _samples.size (); i++)
        {
            answer += _samples[i].size ();
        }
        return answer;
    }